

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

VkBool32 demo_check_layers(uint32_t check_count,char **check_names,uint32_t layer_count,
                          VkLayerProperties *layers)

{
  bool bVar1;
  int iVar2;
  uint local_30;
  VkBool32 found;
  uint32_t j;
  uint32_t i;
  VkLayerProperties *layers_local;
  uint32_t layer_count_local;
  char **check_names_local;
  uint32_t check_count_local;
  
  found = 0;
  do {
    if (check_count <= found) {
      return 1;
    }
    bVar1 = false;
    for (local_30 = 0; local_30 < layer_count; local_30 = local_30 + 1) {
      iVar2 = strcmp(check_names[found],layers[local_30].layerName);
      if (iVar2 == 0) {
        bVar1 = true;
        break;
      }
    }
    if (!bVar1) {
      fprintf(_stderr,"Cannot find layer: %s\n",check_names[found]);
      return 0;
    }
    found = found + 1;
  } while( true );
}

Assistant:

static VkBool32 demo_check_layers(uint32_t check_count, const char **check_names,
                                  uint32_t layer_count,
                                  VkLayerProperties *layers) {
    uint32_t i, j;
    for (i = 0; i < check_count; i++) {
        VkBool32 found = 0;
        for (j = 0; j < layer_count; j++) {
            if (!strcmp(check_names[i], layers[j].layerName)) {
                found = 1;
                break;
            }
        }
        if (!found) {
            fprintf(stderr, "Cannot find layer: %s\n", check_names[i]);
            return 0;
        }
    }
    return 1;
}